

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  bool bVar1;
  CppType CVar2;
  int iVar3;
  uint uVar4;
  Descriptor *pDVar5;
  Reflection *this;
  FieldDescriptor *pFVar6;
  reference ppFVar7;
  FieldDescriptor *this_00;
  MapFieldBase *this_01;
  MapValueConstRef *this_02;
  Message *pMVar8;
  int local_124;
  int j;
  int size;
  MapIterator end;
  MapIterator iter;
  MapFieldBase *map_field;
  FieldDescriptor *value_field;
  FieldDescriptor *field;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  undefined1 local_48 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  int i;
  int field_count;
  Reflection *reflection;
  Descriptor *descriptor;
  Message *message_local;
  
  pDVar5 = Message::GetDescriptor(message);
  this = GetReflectionOrDie(message);
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = Descriptor::field_count(pDVar5);
  for (fields.
       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)fields.
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage <
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)fields.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    pFVar6 = Descriptor::field(pDVar5,(int)fields.
                                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = FieldDescriptor::is_required(pFVar6);
    if (bVar1) {
      pFVar6 = Descriptor::field(pDVar5,(int)fields.
                                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = Reflection::HasField(this,message,pFVar6);
      if (!bVar1) {
        message_local._7_1_ = 0;
        goto LAB_00717c0f;
      }
    }
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_48);
  Reflection::ListFieldsOmitStripped
            (this,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_48);
  __end2 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_48);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_48);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                *)&field);
    if (!bVar1) {
      message_local._7_1_ = 1;
LAB_00717bf9:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_48);
LAB_00717c0f:
      return (bool)(message_local._7_1_ & 1);
    }
    ppFVar7 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end2);
    pFVar6 = *ppFVar7;
    CVar2 = FieldDescriptor::cpp_type(pFVar6);
    if (CVar2 == CPPTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map(pFVar6);
      if (bVar1) {
        pDVar5 = FieldDescriptor::message_type(pFVar6);
        this_00 = Descriptor::field(pDVar5,1);
        CVar2 = FieldDescriptor::cpp_type(this_00);
        if (CVar2 == CPPTYPE_MESSAGE) {
          this_01 = Reflection::GetMapData(this,message,pFVar6);
          bVar1 = MapFieldBase::IsMapValid(this_01);
          if (!bVar1) goto LAB_00717abc;
          MapIterator::MapIterator
                    ((MapIterator *)&end.value_.super_MapValueConstRef.type_,message,pFVar6);
          MapIterator::MapIterator((MapIterator *)&size,message,pFVar6);
          (*this_01->_vptr_MapFieldBase[7])(this_01,&end.value_.super_MapValueConstRef.type_);
          (*this_01->_vptr_MapFieldBase[8])(this_01,&size);
          while (bVar1 = protobuf::operator!=
                                   ((MapIterator *)&end.value_.super_MapValueConstRef.type_,
                                    (MapIterator *)&size), bVar1) {
            this_02 = &MapIterator::GetValueRef
                                 ((MapIterator *)&end.value_.super_MapValueConstRef.type_)->
                       super_MapValueConstRef;
            pMVar8 = MapValueConstRef::GetMessageValue(this_02);
            uVar4 = (*(pMVar8->super_MessageLite)._vptr_MessageLite[5])();
            if ((uVar4 & 1) == 0) {
              message_local._7_1_ = 0;
              j = 1;
              goto LAB_00717a76;
            }
            MapIterator::operator++((MapIterator *)&end.value_.super_MapValueConstRef.type_);
          }
          j = 6;
LAB_00717a76:
          MapIterator::~MapIterator((MapIterator *)&size);
          MapIterator::~MapIterator((MapIterator *)&end.value_.super_MapValueConstRef.type_);
          if (j != 6) goto LAB_00717bf9;
        }
      }
      else {
LAB_00717abc:
        bVar1 = FieldDescriptor::is_repeated(pFVar6);
        if (bVar1) {
          iVar3 = Reflection::FieldSize(this,message,pFVar6);
          for (local_124 = 0; local_124 < iVar3; local_124 = local_124 + 1) {
            pMVar8 = Reflection::GetRepeatedMessage(this,message,pFVar6,local_124);
            uVar4 = (*(pMVar8->super_MessageLite)._vptr_MessageLite[5])();
            if ((uVar4 & 1) == 0) {
              message_local._7_1_ = 0;
              goto LAB_00717bf9;
            }
          }
        }
        else {
          pMVar8 = Reflection::GetMessage(this,message,pFVar6,(MessageFactory *)0x0);
          uVar4 = (*(pMVar8->super_MessageLite)._vptr_MessageLite[5])();
          if ((uVar4 & 1) == 0) {
            message_local._7_1_ = 0;
            goto LAB_00717bf9;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  {
    const int field_count = descriptor->field_count();
    for (int i = 0; i < field_count; i++) {
      if (descriptor->field(i)->is_required()) {
        if (!reflection->HasField(message, descriptor->field(i))) {
          return false;
        }
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  // Should be safe to skip stripped fields because required fields are not
  // stripped.
  reflection->ListFieldsOmitStripped(message, &fields);
  for (const FieldDescriptor* field : fields) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const MapFieldBase* map_field =
              reflection->GetMapData(message, field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                   .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}